

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjExporter::WriteHeader(ObjExporter *this,ostringstream *out)

{
  ostream *poVar1;
  string *psVar2;
  
  poVar1 = std::operator<<((ostream *)out,
                           "# File produced by Open Asset Import Library (http://www.assimp.sf.net)"
                          );
  psVar2 = &this->endl;
  std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<((ostream *)out,"# (assimp v");
  aiGetVersionMajor();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  aiGetVersionMinor();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  aiGetVersionRevision();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,(string *)psVar2);
  return;
}

Assistant:

void ObjExporter::WriteHeader(std::ostringstream& out) {
    out << "# File produced by Open Asset Import Library (http://www.assimp.sf.net)" << endl;
    out << "# (assimp v" << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl  << endl;
}